

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::GetHandle<WarehouseServer,std::vector<Product,std::allocator<Product>>>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          offset_in_WarehouseServer_to_subr method,WarehouseServer *instance)

{
  function<std::vector<Product,_std::allocator<Product>_>_()> *f;
  function<std::vector<Product,_std::allocator<Product>_>_()> local_90;
  anon_class_24_2_b747b145 local_70;
  undefined1 local_58 [8];
  function<std::vector<Product,_std::allocator<Product>_>_()> function;
  WarehouseServer *instance_local;
  offset_in_WarehouseServer_to_subr method_local;
  
  local_70.instance = instance;
  local_70.method = (offset_in_WarehouseServer_to_subr)this;
  local_70._16_8_ = method;
  function._M_invoker = (_Invoker_type)instance;
  std::function<std::vector<Product,std::allocator<Product>>()>::
  function<jsonrpccxx::GetHandle<WarehouseServer,std::vector<Product,std::allocator<Product>>>(std::vector<Product,std::allocator<Product>>(WarehouseServer::*)(),WarehouseServer&)::_lambda()_1_,void>
            ((function<std::vector<Product,std::allocator<Product>>()> *)local_58,&local_70);
  std::function<std::vector<Product,_std::allocator<Product>_>_()>::function
            (&local_90,(function<std::vector<Product,_std::allocator<Product>_>_()> *)local_58);
  GetHandle<std::vector<Product,std::allocator<Product>>>
            (__return_storage_ptr__,(jsonrpccxx *)&local_90,f);
  std::function<std::vector<Product,_std::allocator<Product>_>_()>::~function(&local_90);
  std::function<std::vector<Product,_std::allocator<Product>_>_()>::~function
            ((function<std::vector<Product,_std::allocator<Product>_>_()> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(ReturnType (T::*method)(ParamTypes...), T &instance) {
    std::function<ReturnType(ParamTypes...)> function = [&instance, method](ParamTypes &&... params) -> ReturnType {
      return (instance.*method)(std::forward<ParamTypes>(params)...);
    };
    return GetHandle(function);
  }